

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool CyclicKeyTest<Blob<224>>(pfHash hash,int cycleLen,int cycleReps,int keycount,bool drawDiagram)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint *blob;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  undefined1 local_68 [16];
  pointer local_58;
  Rand local_48;
  
  printf("Keyset \'Cyclic\' - %d cycles of %d bytes - %d keys\n",(ulong)(uint)cycleReps,
         (ulong)(uint)cycleLen);
  local_48.x = 0xab08b840;
  local_48.y = 0x2b75710a;
  local_48.z = 0x9f50b366;
  local_48.w = 0x452ce170;
  local_68 = ZEXT816(0) << 0x20;
  local_58 = (pointer)0x0;
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::resize
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)local_68,(long)keycount);
  iVar2 = cycleLen + 0x10;
  if (cycleLen < -0x10) {
    iVar2 = -1;
  }
  blob = (uint *)operator_new__((long)iVar2);
  uVar7 = cycleReps * cycleLen;
  uVar3 = 0xffffffff;
  if (-1 < (int)uVar7) {
    uVar3 = uVar7;
  }
  pvVar4 = operator_new__((long)(int)uVar3);
  if (0 < keycount) {
    uVar6 = 0;
    do {
      Rand::rand_p(&local_48,blob,cycleLen);
      uVar3 = (uint)uVar6 ^ 0x746a94f1;
      uVar3 = (uVar3 >> 0x10 ^ uVar3) * -0x7a143595;
      uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
      *blob = uVar3 >> 0x10 ^ uVar3;
      if (0 < (int)uVar7) {
        uVar5 = 0;
        do {
          *(undefined1 *)((long)pvVar4 + uVar5) =
               *(undefined1 *)
                ((long)blob +
                ((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                 (long)cycleLen & 0xffffffffU));
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
      }
      (*hash)(pvVar4,uVar7,0,(pointer)(local_68._0_8_ + uVar6 * 0x1c));
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)keycount);
  }
  bVar1 = TestHashList<Blob<224>>
                    ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)local_68,drawDiagram,true,
                     true,true,true);
  putchar(10);
  operator_delete__(blob);
  operator_delete__(pvVar4);
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
  return bVar1;
}

Assistant:

bool CyclicKeyTest ( pfHash hash, int cycleLen, int cycleReps, const int keycount, bool drawDiagram )
{
  printf("Keyset 'Cyclic' - %d cycles of %d bytes - %d keys\n",cycleReps,cycleLen,keycount);

  Rand r(483723);

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  int keyLen = cycleLen * cycleReps;

  uint8_t * cycle = new uint8_t[cycleLen + 16];
  uint8_t * key = new uint8_t[keyLen];

  //----------

  for(int i = 0; i < keycount; i++)
  {
    r.rand_p(cycle,cycleLen);

    *(uint32_t*)cycle = f3mix(i ^ 0x746a94f1);

    for(int j = 0; j < keyLen; j++)
    {
      key[j] = cycle[j % cycleLen];
    }

    hash(key,keyLen,0,&hashes[i]);
  }

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  delete [] cycle;
  delete [] key;

  return result;
}